

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O3

void __thiscall OperandSymbol::defineOperand(OperandSymbol *this,TripleSymbol *tri)

{
  LowlevelError *this_00;
  string local_40;
  
  if ((this->defexp == (PatternExpression *)0x0) && (this->triple == (TripleSymbol *)0x0)) {
    this->triple = tri;
    return;
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Redefining operand","");
  LowlevelError::LowlevelError(this_00,&local_40);
  __cxa_throw(this_00,&SleighError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void OperandSymbol::defineOperand(TripleSymbol *tri)

{
  if ((defexp != (PatternExpression *)0)||(triple!=(TripleSymbol *)0))
    throw SleighError("Redefining operand");
  triple = tri;
}